

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O0

ion_err_t oah_find_item_loc(ion_hashmap_t *hash_map,ion_key_t key,int *location)

{
  char cVar1;
  int num;
  char *pcVar2;
  int key_is_equal;
  ion_hash_bucket_t *item;
  int local_30;
  int count;
  int loc;
  ion_hash_t hash;
  int *location_local;
  ion_key_t key_local;
  ion_hashmap_t *hash_map_local;
  
  num = (*hash_map->compute_hash)(hash_map,key,(hash_map->super).record.key_size);
  local_30 = oah_get_location(num,hash_map->map_size);
  item._4_4_ = 0;
  while( true ) {
    if (item._4_4_ == hash_map->map_size) {
      return '\x01';
    }
    pcVar2 = hash_map->entry +
             ((hash_map->super).record.key_size + (hash_map->super).record.value_size + 1) *
             local_30;
    if (*pcVar2 == -1) break;
    if ((*pcVar2 != -2) &&
       (cVar1 = (*(hash_map->super).compare)(pcVar2 + 1,key,(hash_map->super).record.key_size),
       cVar1 == '\0')) {
      *location = local_30;
      return '\0';
    }
    item._4_4_ = item._4_4_ + 1;
    local_30 = local_30 + 1;
    if (hash_map->map_size <= local_30) {
      local_30 = 0;
    }
  }
  return '\x01';
}

Assistant:

ion_err_t
oah_find_item_loc(
	ion_hashmap_t	*hash_map,
	ion_key_t		key,
	int				*location
) {
	/* compute hash value for given key */
	ion_hash_t hash = hash_map->compute_hash(hash_map, key, hash_map->super.record.key_size);

	int loc			= oah_get_location(hash, hash_map->map_size);
	/* determine bucket based on hash */

	int count		= 0;

	while (count != hash_map->map_size) {
		/* check to see if current item is a match based on key */
		/* locate first item */
		ion_hash_bucket_t *item = (((ion_hash_bucket_t *) ((hash_map->entry + (hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS)) * loc))));

		if (item->status == ION_EMPTY) {
			return err_item_not_found;	/* if you hit an empty cell, exit */
		}
		else {
			/* calculate if there is a match */

			if (item->status != ION_DELETED) {
				int key_is_equal = hash_map->super.compare(item->data, key, hash_map->super.record.key_size);

				if (ION_IS_EQUAL == key_is_equal) {
					(*location) = loc;
					return err_ok;
				}
			}

			count++;
			loc++;

			if (loc >= hash_map->map_size) {
				/* Perform wrapping */
				loc = 0;
			}
		}
	}

	return err_item_not_found;	/* key have not been found */
}